

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

void __thiscall
HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator>::~HashTable
          (HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *this)

{
  ArenaAllocator *pAVar1;
  Type_conflict pSVar2;
  bool bVar3;
  Type_conflict *ppSVar4;
  SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount> *this_00;
  long *plVar5;
  long extraout_RDX;
  code *local_70;
  uint local_44;
  uint i;
  HashTable<ObjTypeGuardBucket,_Memory::ArenaAllocator> *this_local;
  FreeFuncType freeFunc;
  NodeBase *next;
  NodeBase *current;
  
  for (local_44 = 0; local_44 < this->tableSize; local_44 = local_44 + 1) {
    this_00 = this->table + local_44;
    pAVar1 = this->alloc;
    ppSVar4 = SListNodeBase<Memory::ArenaAllocator>::Next
                        (&this_00->super_SListNodeBase<Memory::ArenaAllocator>);
    next = *ppSVar4;
    while (bVar3 = SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::IsHead
                             (this_00,next), ((bVar3 ^ 0xffU) & 1) != 0) {
      ppSVar4 = SListNodeBase<Memory::ArenaAllocator>::Next(next);
      pSVar2 = *ppSVar4;
      local_70 = (code *)Memory::
                         TypeAllocatorFunc<Memory::ArenaAllocator,_Bucket<ObjTypeGuardBucket>_>::
                         GetFreeFunc();
      plVar5 = (long *)((long)&(pAVar1->
                               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                               ).super_Allocator.outOfMemoryFunc + extraout_RDX);
      if (((ulong)local_70 & 1) != 0) {
        local_70 = *(code **)(local_70 + *plVar5 + -1);
      }
      (*local_70)(plVar5,next,0x20);
      next = pSVar2;
    }
    SListBase<Bucket<ObjTypeGuardBucket>,_Memory::ArenaAllocator,_RealCount>::Reset(this_00);
  }
  return;
}

Assistant:

~HashTable()
    {
        for (uint i = 0; i< tableSize; i++)
        {
            table[i].Clear(alloc);
        }
    }